

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtension
          (ExtensionSet *this,int wire_type,uint32_t field,Message *extendee,ParseContext *ctx,
          ExtensionInfo *extension,bool *was_packed_on_wire)

{
  DescriptorPool *pDVar1;
  MessageFactory *pMVar2;
  bool bVar3;
  Metadata MVar4;
  GeneratedExtensionFinder finder_1;
  DescriptorPoolExtensionFinder local_48;
  
  pDVar1 = (ctx->data_).pool;
  if (pDVar1 == (DescriptorPool *)0x0) {
    local_48.pool_ = (DescriptorPool *)extendee;
    bVar3 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                      (this,wire_type,field,(GeneratedExtensionFinder *)&local_48,extension,
                       was_packed_on_wire);
  }
  else {
    pMVar2 = (ctx->data_).factory;
    MVar4 = Message::GetMetadata(extendee);
    local_48.containing_type_ = MVar4.descriptor;
    local_48.pool_ = pDVar1;
    local_48.factory_ = pMVar2;
    bVar3 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>
                      (this,wire_type,field,&local_48,extension,was_packed_on_wire);
  }
  return bVar3 != false;
}

Assistant:

bool ExtensionSet::FindExtension(int wire_type, uint32_t field,
                                 const Message* extendee,
                                 const internal::ParseContext* ctx,
                                 ExtensionInfo* extension,
                                 bool* was_packed_on_wire) {
  if (ctx->data().pool == nullptr) {
    GeneratedExtensionFinder finder(extendee);
    if (!FindExtensionInfoFromFieldNumber(wire_type, field, &finder, extension,
                                          was_packed_on_wire)) {
      return false;
    }
  } else {
    DescriptorPoolExtensionFinder finder(ctx->data().pool, ctx->data().factory,
                                         extendee->GetDescriptor());
    if (!FindExtensionInfoFromFieldNumber(wire_type, field, &finder, extension,
                                          was_packed_on_wire)) {
      return false;
    }
  }
  return true;
}